

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::CooperativeVectorNV::CooperativeVectorNV
          (CooperativeVectorNV *this,Type *type,uint32_t components)

{
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Type).kind_ = kCooperativeVectorNV;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Type_0094d1e0;
  this->component_type_ = type;
  this->components_ = components;
  if (type == (Type *)0x0) {
    __assert_fail("type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                  ,0x34e,
                  "spvtools::opt::analysis::CooperativeVectorNV::CooperativeVectorNV(const Type *, const uint32_t)"
                 );
  }
  if (components != 0) {
    return;
  }
  __assert_fail("components != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                ,0x34f,
                "spvtools::opt::analysis::CooperativeVectorNV::CooperativeVectorNV(const Type *, const uint32_t)"
               );
}

Assistant:

CooperativeVectorNV::CooperativeVectorNV(const Type* type,
                                         const uint32_t components)
    : Type(kCooperativeVectorNV),
      component_type_(type),
      components_(components) {
  assert(type != nullptr);
  assert(components != 0);
}